

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O1

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_coop_mat_clamp(Impl *this,SPIRVModule *module,Id type_id)

{
  Builder *this_00;
  Vector<std::unique_ptr<Instruction>_> *pVVar1;
  pointer *ppCVar2;
  uint uVar3;
  pointer pCVar4;
  pointer pCVar5;
  iterator iVar6;
  iterator __position;
  Impl *pIVar7;
  Block *pBVar8;
  Block *elseBlock;
  Id in_EAX;
  Id IVar9;
  Id IVar10;
  Function *pFVar11;
  Instruction *pIVar12;
  Instruction *pIVar13;
  Instruction *pIVar14;
  Id *pIVar15;
  bool bVar16;
  Block *entry;
  Vector<Id> local_c8;
  Id local_a4;
  Function *local_a0;
  Impl *local_98;
  uint local_8c;
  Instruction *local_88;
  Block *local_80;
  Id local_74;
  Block *local_70;
  Block *local_68;
  Vector<std::unique_ptr<Instruction>_> *local_60;
  Instruction *local_58;
  Block *local_50;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_48;
  
  pCVar4 = (this->coop_mat_conv_ids).
           super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar5 = (this->coop_mat_conv_ids).
           super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar16 = pCVar4 == pCVar5;
  if (!bVar16) {
    pIVar15 = &pCVar4->func_id;
    do {
      if (pIVar15[1] == CoopMatClamp && ((CoopMatConvOp *)(pIVar15 + -2))->input_type == type_id) {
        in_EAX = *pIVar15;
        break;
      }
      bVar16 = (pointer)(pIVar15 + 2) == pCVar5;
      pIVar15 = pIVar15 + 4;
    } while (!bVar16);
  }
  if (bVar16) {
    this_00 = &this->builder;
    local_50 = (this->builder).buildPoint;
    local_68 = (Block *)0x0;
    local_98 = this;
    IVar9 = spv::Builder::makeIntegerType(this_00,0x20,false);
    local_88 = (Instruction *)CONCAT44(local_88._4_4_,IVar9);
    IVar9 = spv::Builder::makeFloatType(this_00,0x20);
    local_74 = spv::Builder::makeBoolType(this_00);
    IVar10 = spv::Builder::makePointer(this_00,StorageClassFunction,type_id);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0xc);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start + 3;
    *local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = IVar10;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[1] = IVar9;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[2] = IVar9;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_a4 = IVar9;
    pFVar11 = spv::Builder::makeFunctionEntry
                        (this_00,DecorationMax,type_id,"CoopMatClamp",&local_c8,&local_48,&local_68)
    ;
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector(&local_48);
    if (local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
      free_in_thread(local_c8.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
    local_8c = spv::Builder::createVariable(this_00,StorageClassFunction,type_id,"coop_output");
    local_58 = spv::Builder::addInstruction(this_00,(Id)local_88,OpCooperativeMatrixLengthKHR);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_c8.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,type_id);
    iVar6._M_current =
         (local_58->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (local_58->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &local_58->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current = type_id;
      (local_58->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    pIVar7 = local_98;
    local_80 = (Block *)allocate_in_thread(0x78);
    IVar9 = (pIVar7->builder).uniqueId + 1;
    (pIVar7->builder).uniqueId = IVar9;
    local_80->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
    pVVar1 = &local_80->instructions;
    (local_80->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_80->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_80->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_80->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_80->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_80->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_80->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_80->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_80->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_80->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_80->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_80->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80->parent = pFVar11;
    local_80->unreachable = false;
    local_a0 = pFVar11;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
    *(undefined ***)
     local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = &PTR__Instruction_001f81e0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[2] = IVar9;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[3] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[4] = 0xf8;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[6] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[7] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[8] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[9] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[10] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xb] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xc] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xd] = 0;
    local_60 = pVVar1;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)pVVar1,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_c8);
    if (local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_c8.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    pFVar11 = local_a0;
    ((local_80->instructions).
     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_80;
    spv::Module::mapInstruction
              (local_a0->parent,
               (local_80->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    local_70 = (Block *)allocate_in_thread(0x78);
    IVar9 = (pIVar7->builder).uniqueId + 1;
    (pIVar7->builder).uniqueId = IVar9;
    local_70->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
    pVVar1 = &local_70->instructions;
    (local_70->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_70->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_70->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_70->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_70->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_70->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_70->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_70->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_70->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_70->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_70->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_70->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70->parent = pFVar11;
    local_70->unreachable = false;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
    *(undefined ***)
     local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = &PTR__Instruction_001f81e0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[2] = IVar9;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[3] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[4] = 0xf8;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[6] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[7] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[8] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[9] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[10] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xb] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xc] = 0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xd] = 0;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)pVVar1,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_c8);
    if (local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_c8.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    pFVar11 = local_a0;
    ((local_70->instructions).
     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_70;
    spv::Module::mapInstruction
              (local_a0->parent,
               (local_70->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    pBVar8 = local_80;
    spv::Builder::createBranch(this_00,local_80);
    (local_98->builder).buildPoint = pBVar8;
    IVar9 = (Id)local_88;
    pIVar12 = spv::Builder::addInstruction(this_00,(Id)local_88,OpPhi);
    pIVar13 = spv::Builder::addInstruction(this_00,IVar9,OpIAdd);
    uVar3 = pIVar12->resultId;
    iVar6._M_current =
         (pIVar13->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = uVar3;
    if (iVar6._M_current ==
        (pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar13->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current = uVar3;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    IVar9 = spv::Builder::makeIntegerType(this_00,0x20,false);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = spv::Builder::makeIntConstant(this_00,IVar9,1,false);
    iVar6._M_current =
         (pIVar13->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar13->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    IVar9 = spv::Builder::makeIntegerType(this_00,0x20,false);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = spv::Builder::makeIntConstant(this_00,IVar9,0,false);
    iVar6._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ =
         *(uint *)((long)(((local_68->instructions).
                           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                         ._M_t + 8);
    iVar6._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = pIVar13->resultId;
    iVar6._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ =
         *(uint *)((long)(((local_60->
                           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                  + 8);
    iVar6._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_88 = pIVar13;
    if (iVar6._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    IVar9 = spv::Builder::makePointer(this_00,StorageClassFunction,local_a4);
    pIVar13 = spv::Builder::addInstruction(this_00,IVar9,OpInBoundsAccessChain);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ =
         (*(pFVar11->parameterInstructions).
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start)->resultId;
    iVar6._M_current =
         (pIVar13->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar13->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
    iVar6._M_current =
         (pIVar13->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar13->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    pIVar14 = spv::Builder::addInstruction(this_00,local_a4,OpLoad);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = pIVar13->resultId;
    iVar6._M_current =
         (pIVar14->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar14->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar14->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar14->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    IVar9 = spv::Builder::makePointer(this_00,StorageClassFunction,local_a4);
    pIVar13 = spv::Builder::addInstruction(this_00,IVar9,OpInBoundsAccessChain);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = local_8c;
    iVar6._M_current =
         (pIVar13->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar13->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current = local_8c;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
    iVar6._M_current =
         (pIVar13->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar13->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar13->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    IVar9 = spv::Builder::import(this_00,"GLSL.std.450");
    pIVar12 = spv::Builder::addInstruction(this_00,local_a4,OpExtInst);
    iVar6._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = IVar9;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current = IVar9;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    pFVar11 = local_a0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0x2b;
    iVar6._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current = 0x2b;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = pIVar14->resultId;
    iVar6._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ =
         (pFVar11->parameterInstructions).
         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_start[1]->resultId;
    iVar6._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ =
         (pFVar11->parameterInstructions).
         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_start[2]->resultId;
    iVar6._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    pIVar14 = spv::Builder::addInstruction(this_00,OpStore);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = pIVar13->resultId;
    iVar6._M_current =
         (pIVar14->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar14->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar14->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar14->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
    iVar6._M_current =
         (pIVar14->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar14->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar14->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar14->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    pIVar7 = local_98;
    pIVar12 = spv::Builder::addInstruction(this_00,local_74,OpULessThan);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = local_88->resultId;
    iVar6._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = local_58->resultId;
    iVar6._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current =
           (uint)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    elseBlock = local_70;
    pBVar8 = local_80;
    spv::Builder::createLoopMerge(this_00,local_70,local_80,0);
    spv::Builder::createConditionalBranch(this_00,pIVar12->resultId,pBVar8,elseBlock);
    (pIVar7->builder).buildPoint = elseBlock;
    pIVar12 = spv::Builder::addInstruction(this_00,type_id,OpLoad);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_c8.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,local_8c);
    iVar6._M_current =
         (pIVar12->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar12->operands,iVar6,(uint *)&local_c8);
    }
    else {
      *iVar6._M_current = local_8c;
      (pIVar12->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    pFVar11 = local_a0;
    spv::Builder::makeReturn(this_00,false,pIVar12->resultId);
    (pIVar7->builder).buildPoint = local_50;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)CONCAT44(type_id,type_id);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(0x20,(pFVar11->functionInstruction).resultId);
    __position._M_current =
         (pIVar7->coop_mat_conv_ids).
         super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pIVar7->coop_mat_conv_ids).
        super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
      ::_M_realloc_insert<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>
                (&pIVar7->coop_mat_conv_ids,__position,(CoopMatConvOp *)&local_c8);
    }
    else {
      *(pointer *)__position._M_current =
           local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
      *(pointer *)&(__position._M_current)->func_id =
           local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppCVar2 = &(pIVar7->coop_mat_conv_ids).
                 super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar2 = *ppCVar2 + 1;
    }
    in_EAX = (pFVar11->functionInstruction).resultId;
  }
  return in_EAX;
}

Assistant:

spv::Id SPIRVModule::Impl::build_coop_mat_clamp(SPIRVModule &module, spv::Id type_id)
{
	for (auto &ops : coop_mat_conv_ids)
		if (ops.input_type == type_id && ops.call == HelperCall::CoopMatClamp)
			return ops.func_id;
	auto *current_build_point = builder.getBuildPoint();

	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id f32_type = builder.makeFloatType(32);
	spv::Id bool_type = builder.makeBoolType();

	// RADV workaround. It fails to understand coopmat passed as value.
	spv::Id float_ptr_type = builder.makePointer(spv::StorageClassFunction, type_id);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, type_id,
	                                       "CoopMatClamp",
	                                       { float_ptr_type, f32_type, f32_type }, {}, &entry);

	spv::Id output_id = create_variable(spv::StorageClassFunction, type_id, "coop_output");

	auto *len = builder.addInstruction(uint_type, spv::OpCooperativeMatrixLengthKHR);
	len->addIdOperand(type_id);

	auto *header = new spv::Block(builder.getUniqueId(), *func);
	auto *merge = new spv::Block(builder.getUniqueId(), *func);
	builder.createBranch(header);
	builder.setBuildPoint(header);
	{
		auto *phi = builder.addInstruction(uint_type, spv::OpPhi);
		auto *iter = builder.addInstruction(uint_type, spv::OpIAdd);
		iter->addIdOperand(phi->getResultId());
		iter->addIdOperand(builder.makeUintConstant(1));

		phi->addIdOperand(builder.makeUintConstant(0));
		phi->addIdOperand(entry->getId());
		phi->addIdOperand(iter->getResultId());
		phi->addIdOperand(header->getId());

		auto *input_chain = builder.addInstruction(
		    builder.makePointer(spv::StorageClassFunction, f32_type), spv::OpInBoundsAccessChain);
		input_chain->addIdOperand(func->getParamId(0));
		input_chain->addIdOperand(phi->getResultId());

		auto *load = builder.addInstruction(f32_type, spv::OpLoad);
		load->addIdOperand(input_chain->getResultId());

		auto *output_chain = builder.addInstruction(
		    builder.makePointer(spv::StorageClassFunction, f32_type), spv::OpInBoundsAccessChain);
		output_chain->addIdOperand(output_id);
		output_chain->addIdOperand(phi->getResultId());

		spv::Id std450 = builder.import("GLSL.std.450");
		auto *clamp = builder.addInstruction(f32_type, spv::OpExtInst);
		clamp->addIdOperand(std450);
		clamp->addImmediateOperand(GLSLstd450FClamp);
		clamp->addIdOperand(load->getResultId());
		clamp->addIdOperand(func->getParamId(1));
		clamp->addIdOperand(func->getParamId(2));

		auto *store = builder.addInstruction(spv::OpStore);
		store->addIdOperand(output_chain->getResultId());
		store->addIdOperand(clamp->getResultId());

		auto *cmp = builder.addInstruction(bool_type, spv::OpULessThan);
		cmp->addIdOperand(iter->getResultId());
		cmp->addIdOperand(len->getResultId());
		builder.createLoopMerge(merge, header, 0);
		builder.createConditionalBranch(cmp->getResultId(), header, merge);
	}

	builder.setBuildPoint(merge);
	auto *loaded_result = builder.addInstruction(type_id, spv::OpLoad);
	loaded_result->addIdOperand(output_id);

	builder.makeReturn(false, loaded_result->getResultId());

	builder.setBuildPoint(current_build_point);
	coop_mat_conv_ids.push_back({ type_id, type_id, func->getId(), HelperCall::CoopMatClamp });
	return func->getId();
}